

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

bool __thiscall PFloat::ReadValue(PFloat *this,FArchive *ar,void *addr)

{
  bool bVar1;
  uint uVar2;
  double extraout_XMM0_Qa;
  double val;
  BYTE tag;
  double local_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  byte local_21;
  
  FArchive::operator<<(ar,&local_21);
  switch(local_21) {
  case 0:
    FArchive::operator<<(ar,(BYTE *)&local_30);
    uVar2 = (uint)(char)(byte)local_30;
    goto LAB_0049de78;
  case 1:
    FArchive::operator<<(ar,(BYTE *)&local_30);
    uVar2 = (uint)(byte)local_30;
    goto LAB_0049de78;
  case 2:
    FArchive::operator<<(ar,(WORD *)&local_30);
    uVar2 = (uint)CONCAT11(local_30._1_1_,(byte)local_30);
    goto LAB_0049de78;
  case 3:
    FArchive::operator<<(ar,(WORD *)&local_30);
    uVar2 = (uint)CONCAT11(local_30._1_1_,(byte)local_30);
LAB_0049de78:
    local_38 = (double)(int)uVar2;
    break;
  case 4:
    FArchive::operator<<(ar,&local_30);
    local_38 = (double)CONCAT22(local_30._2_2_,CONCAT11(local_30._1_1_,(byte)local_30));
    break;
  case 5:
    FArchive::operator<<(ar,&local_30);
    local_38 = (double)CONCAT22(local_30._2_2_,CONCAT11(local_30._1_1_,(byte)local_30));
    break;
  case 6:
    FArchive::operator<<(ar,(QWORD *)&local_30);
    local_38 = (double)CONCAT44(uStack_2c,
                                CONCAT22(local_30._2_2_,CONCAT11(local_30._1_1_,(byte)local_30)));
    break;
  case 7:
    FArchive::operator<<(ar,(QWORD *)&local_30);
    local_38 = ((double)CONCAT44(0x45300000,uStack_2c) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,
                                 CONCAT22(local_30._2_2_,CONCAT11(local_30._1_1_,(byte)local_30))) -
               4503599627370496.0);
    break;
  case 8:
    local_38 = 0.0;
    break;
  case 9:
    local_38 = 1.0;
    break;
  case 10:
    FArchive::operator<<(ar,(float *)&local_30);
    local_38 = (double)(float)CONCAT22(local_30._2_2_,CONCAT11(local_30._1_1_,(byte)local_30));
    break;
  case 0xb:
    FArchive::operator<<(ar,&local_38);
    break;
  default:
    PType::SkipValue(ar,(uint)local_21);
    bVar1 = false;
    local_38 = extraout_XMM0_Qa;
    goto LAB_0049de88;
  }
  bVar1 = true;
LAB_0049de88:
  if (bVar1 != false) {
    if (*(int *)&(this->super_PBasicType).super_PType.super_DObject.field_0x24 == 4) {
      *(float *)addr = (float)local_38;
    }
    else {
      *(double *)addr = local_38;
    }
  }
  return bVar1;
}

Assistant:

bool PFloat::ReadValue(FArchive &ar, void *addr) const
{
	BYTE tag;
	ar << tag;
	double val;
	if (ReadValueDbl(ar, &val, tag))
	{
		if (Size == 4)
		{
			*(float *)addr = (float)val;
		}
		else
		{
			*(double *)addr = val;
		}
		return true;
	}
	return false;
}